

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSAVEAMSDOS(void)

{
  bool bVar1;
  int iVar2;
  EStatus type;
  aint val;
  char *message;
  aint args [4];
  bool optional [4];
  path fnaam;
  
  iVar2 = pass;
  if (DeviceID == (char *)0x0) {
    Error("SAVEAMSDOS works in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  args[0] = -1;
  args[1] = -1;
  args[2] = 0;
  args[3] = 2;
  optional[0] = false;
  optional[1] = false;
  optional[2] = true;
  optional[3] = true;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = getIntArguments<4>(&lp,&args,&optional);
    if (bVar1) {
      type = PASS3;
      message = "[SAVEAMSDOS] [address, size] region outside of 64ki";
      if ((-1 < args[0]) && (args[0] + args[1] < 0x10001 && 0 < args[1])) {
        check16u(args[2]);
        val = args[3];
        if ((long)args._8_8_ < 0) {
          args[3] = -0x1000;
          val = -0x1000;
        }
        check8(val);
        if (iVar2 != 3) goto LAB_0010e2c9;
        iVar2 = SaveBinaryAmsdos(&fnaam,args[0],args[1],(word)args[2],(byte)args[3]);
        if (iVar2 != 0) goto LAB_0010e2c9;
        type = IF_FIRST;
        message = "[SAVEAMSDOS] Error writing file (Disk full?)";
      }
      Error(message,bp,type);
      goto LAB_0010e2c9;
    }
  }
  Error("[SAVEAMSDOS] expected syntax is <filename>,<address>,<size>[,<start = 0>[,<type = 2>]",bp,
        SUPPRESS);
LAB_0010e2c9:
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

static void dirSAVEAMSDOS() {
	if (!DeviceID) {
		Error("SAVEAMSDOS works in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}
	bool exec = (LASTPASS == pass);
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	aint args[] = { -1, -1, 0, 2 };	// address, size, start, type
	const bool optional[] = {false, false, true, true};
	if (!anyComma(lp) || !getIntArguments<4>(lp, args, optional)) {
		Error("[SAVEAMSDOS] expected syntax is <filename>,<address>,<size>[,<start = 0>[,<type = 2>]", bp, SUPPRESS);
		return;
	}
	aint &address = args[0], &size = args[1], &start = args[2], &type = args[3];
	if (address < 0 || size < 1 || 0x10000 < address + size) {
		Error("[SAVEAMSDOS] [address, size] region outside of 64ki", bp);
		return;
	}
	check16u(start);
	if (type < 0) type = -0x1000;		// check8 works for -256..+255 values, in this case just 0..255 is valid
	check8(type);
	if (exec && !SaveBinaryAmsdos(fnaam, address, size, start, type)) {
		Error("[SAVEAMSDOS] Error writing file (Disk full?)", bp, IF_FIRST);
	}
}